

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

void __thiscall Parse::SMTLIB2::readDeclareSort(SMTLIB2 *this,string *name,string *arity)

{
  Symbol *this_00;
  bool bVar1;
  uint uVar2;
  OperatorType *type;
  UserErrorException *pUVar3;
  uint val;
  bool added;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string pName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&pName,name,"()");
  bVar1 = isAlreadyKnownSymbol(this,&pName);
  if (bVar1) {
    pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_128,"Redeclaring built-in, declared or defined sort symbol: ",name);
    std::operator+(&local_108,&local_128," in top-level expression \'");
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_148,this->_topLevelExpr,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,
                   &local_108,&local_148);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,"\'")
    ;
    Lib::UserErrorException::Exception(pUVar3,&local_48);
    __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  std::__cxx11::string::string((string *)&local_a8,(string *)arity);
  bVar1 = Lib::StringUtils::isPositiveInteger(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    bVar1 = Lib::Int::stringToUnsignedInt(arity,&val);
    if (bVar1) {
      uVar2 = Kernel::Signature::addTypeCon(DAT_00a14190,&pName,val,&added);
      std::__cxx11::string::string((string *)&local_c8,(string *)&pName);
      Lib::
      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(&this->_declaredSymbols,&local_c8,
               (pair<unsigned_int,_Parse::SMTLIB2::SymbolType>)((ulong)uVar2 | 0x200000000));
      std::__cxx11::string::~string((string *)&local_c8);
      this_00 = (DAT_00a14190->_typeCons)._stack[uVar2];
      type = Kernel::OperatorType::getTypeConType(val);
      Kernel::Signature::Symbol::setType(this_00,type);
      std::__cxx11::string::~string((string *)&pName);
      return;
    }
    pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_128,"Couldn\'t convert sort arity: ",arity);
    std::operator+(&local_108,&local_128," in top-level expression \'");
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_148,this->_topLevelExpr,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,
                   &local_108,&local_148);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,"\'")
    ;
    Lib::UserErrorException::Exception(pUVar3,&local_88);
    __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
  std::operator+(&local_128,"Unrecognized declared sort arity: ",arity);
  std::operator+(&local_108,&local_128," in top-level expression \'");
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_148,this->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,
                 &local_108,&local_148);
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added,"\'");
  Lib::UserErrorException::Exception(pUVar3,&local_68);
  __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

void SMTLIB2::readDeclareSort(const std::string& name, const std::string& arity)
{
  std::string pName = name + TYPECON_POSTFIX;
  if (isAlreadyKnownSymbol(pName)) {
    USER_ERROR_EXPR("Redeclaring built-in, declared or defined sort symbol: "+name);
  }

  if (not StringUtils::isPositiveInteger(arity)) {
    USER_ERROR_EXPR("Unrecognized declared sort arity: "+arity);
  }

  unsigned val;
  if (!Int::stringToUnsignedInt(arity, val)) {
    USER_ERROR_EXPR("Couldn't convert sort arity: "+arity);
  }

  bool added;
  unsigned srt = env.signature->addTypeCon(pName,val,added);
  ASS(added);
  ALWAYS(_declaredSymbols.insert(pName,make_pair(srt,SymbolType::TYPECON)));
  env.signature->getTypeCon(srt)->setType(OperatorType::getTypeConType(val));
}